

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# border.cpp
# Opt level: O1

Element __thiscall ftxui::window(ftxui *this,Element *title,Element *content)

{
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *extraout_RDX_01;
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Var1;
  Element EVar2;
  undefined1 local_51;
  Border *local_50;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_48;
  shared_ptr<ftxui::Node> local_40;
  element_type *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  Elements local_20;
  
  local_30 = (content->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_28 = (content->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount.
             _M_pi;
  (content->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (content->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr =
       (element_type *)0x0;
  local_40.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (title->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  local_40.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (title->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi;
  (title->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  (title->super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr = (element_type *)0x0;
  unpack<std::shared_ptr<ftxui::Node>,std::shared_ptr<ftxui::Node>>
            (&local_20,(ftxui *)&local_30,&local_40,(shared_ptr<ftxui::Node> *)0x0);
  local_50 = (Border *)0x0;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::
  __shared_count<ftxui::Border,std::allocator<ftxui::Border>,std::vector<std::shared_ptr<ftxui::Node>,std::allocator<std::shared_ptr<ftxui::Node>>>>
            (&local_48,&local_50,(allocator<ftxui::Border> *)&local_51,&local_20);
  _Var1._M_pi = local_48._M_pi;
  *(Border **)this = local_50;
  *(undefined8 *)(this + 8) = 0;
  local_48._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> **)(this + 8) = _Var1._M_pi;
  local_50 = (Border *)0x0;
  std::vector<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>::~vector
            (&local_20);
  _Var1._M_pi = extraout_RDX;
  if (local_40.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_40.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    _Var1._M_pi = extraout_RDX_00;
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
    _Var1._M_pi = extraout_RDX_01;
  }
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = _Var1._M_pi;
  EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr = (element_type *)this;
  return (Element)EVar2.super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>;
}

Assistant:

Element window(Element title, Element content) {
  return std::make_shared<Border>(unpack(std::move(content), std::move(title)));
}